

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O3

void __thiscall Liby::Poller::Poller(Poller *this)

{
  size_type __n;
  allocator_type local_21;
  value_type local_20;
  
  this->_vptr_Poller = (_func_int **)&PTR__Poller_0012d408;
  __n = sysconf(4);
  local_20 = (value_type)0x0;
  std::vector<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>::vector
            (&this->channels_,__n,&local_20,&local_21);
  (this->nextTickHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->nextTickHandlers_;
  (this->nextTickHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->nextTickHandlers_;
  (this->nextTickHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->nextLoopHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->nextLoopHandlers_;
  (this->nextLoopHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->nextLoopHandlers_;
  (this->nextLoopHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->afterLoopHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->afterLoopHandlers_;
  (this->afterLoopHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->afterLoopHandlers_;
  (this->afterLoopHandlers_).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  return;
}

Assistant:

Poller::Poller() : channels_(get_open_max(), nullptr) {}